

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternConstantInfo,_false,_false>::grow_and_add
          (FastVector<ExternConstantInfo,_false,_false> *this,uint newSize,
          ExternConstantInfo *valPtr,uint elem)

{
  uint uVar1;
  uint uVar2;
  ExternConstantInfo *ptr;
  ExternConstantInfo *pEVar3;
  uint local_38;
  uint i;
  uint oldMax;
  ExternConstantInfo *oldData;
  uint elem_local;
  ExternConstantInfo *valPtr_local;
  uint newSize_local;
  FastVector<ExternConstantInfo,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  for (local_38 = 0; local_38 < elem; local_38 = local_38 + 1) {
    pEVar3 = this->data;
    uVar2 = this->count;
    this->count = uVar2 + 1;
    *(undefined8 *)(pEVar3 + uVar2) = *(undefined8 *)(valPtr + local_38);
    *(undefined4 *)((long)&pEVar3[uVar2].value + 4) =
         *(undefined4 *)((long)&valPtr[local_38].value + 4);
  }
  if (ptr != (ExternConstantInfo *)0x0) {
    NULLC::destruct<ExternConstantInfo>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}